

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.hpp
# Opt level: O0

int __thiscall sp::template_classifier::get_threshold_(template_classifier *this,Mat *mat)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int *piVar3;
  int iVar4;
  Mat *in_RSI;
  double *in_RDI;
  undefined1 in_ZMM1 [64];
  int i;
  double left;
  uint32_t j;
  uchar *lhs;
  uint32_t i_1;
  int histogram [256];
  uint32_t sum_pixel;
  uint32_t iter_cols;
  uint32_t iter_rows;
  int local_450;
  int local_44c;
  double local_448;
  uint local_43c;
  byte *local_438;
  uint local_42c;
  int local_428 [259];
  uint local_1c;
  uint local_18;
  uint local_14;
  Mat *local_10;
  
  local_14 = *(uint *)(in_RSI + 8);
  local_18 = *(uint *)(in_RSI + 0xc);
  local_1c = local_14 * local_18;
  local_10 = in_RSI;
  bVar2 = cv::Mat::isContinuous(in_RSI);
  if (bVar2) {
    local_18 = local_1c;
    local_14 = 1;
  }
  memset(local_428,0,0x400);
  for (local_42c = 0; local_42c < local_14; local_42c = local_42c + 1) {
    local_438 = cv::Mat::ptr<unsigned_char>(local_10,local_42c);
    for (local_43c = 0; local_43c < local_18; local_43c = local_43c + 1) {
      local_428[*local_438] = local_428[*local_438] + 1;
      local_438 = local_438 + 1;
    }
  }
  auVar1 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,local_1c);
  local_448 = *in_RDI * auVar1._0_8_;
  local_44c = 0xff;
  do {
    iVar4 = local_44c + -1;
    local_448 = local_448 - (double)local_428[local_44c];
    local_44c = iVar4;
  } while (0.0 < local_448);
  local_450 = 0;
  piVar3 = std::max<int>(&local_44c,&local_450);
  return *piVar3;
}

Assistant:

inline int         get_threshold_(cv::Mat& mat)
	{
	    uint32_t iter_rows = mat.rows;
	    uint32_t iter_cols = mat.cols;
	    auto sum_pixel = iter_rows * iter_cols;
	    if(mat.isContinuous())
	    {
	        iter_cols = sum_pixel;
	        iter_rows = 1;
	    }
	    int histogram[256];
	    memset(histogram, 0, sizeof(histogram));
	    for (uint32_t i = 0; i < iter_rows; ++i)
	    {
	        const uchar* lhs = mat.ptr<uchar>(i);
	        for (uint32_t j = 0; j < iter_cols; ++j)
	            ++histogram[*lhs++];
	    }
	    auto left = thre_proportion * sum_pixel;
	    int i = 255;
	    while((left -= histogram[i--]) > 0);
	    return std::max(i, 0);
	}